

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O0

int launchTests(testDescPtr tst)

{
  undefined8 uVar1;
  FILE *__stream;
  int iVar2;
  undefined1 local_88 [8];
  glob_t globbuf;
  char *pcStack_38;
  int mem;
  char *error;
  char *result;
  size_t i;
  int err;
  int res;
  testDescPtr tst_local;
  
  i._0_4_ = 0;
  if (tst == (testDescPtr)0x0) {
    tst_local._4_4_ = 0xffffffff;
  }
  else {
    if (tst->in == (char *)0x0) {
      iVar2 = (*tst->func)((char *)0x0,(char *)0x0,(char *)0x0,tst->options);
      if (iVar2 != 0) {
        nb_errors = nb_errors + 1;
      }
      i._0_4_ = (uint)(iVar2 != 0);
    }
    else {
      globbuf.gl_pathv = (char **)0x0;
      glob64(tst->in,8,(__errfunc *)0x0,(glob64_t *)local_88);
      for (result = (char *)0x0; result < (ulong)local_88; result = result + 1) {
        iVar2 = checkTestFile(*(char **)(globbuf.gl_pathc + (long)result * 8));
        if (iVar2 != 0) {
          if (tst->suffix == (char *)0x0) {
            error = (char *)0x0;
          }
          else {
            error = resultFilename(*(char **)(globbuf.gl_pathc + (long)result * 8),tst->out,
                                   tst->suffix);
            if (error == (char *)0x0) {
              fprintf(_stderr,"Out of memory !\n");
              fatalError();
            }
          }
          if (tst->err == (char *)0x0) {
            pcStack_38 = (char *)0x0;
          }
          else {
            pcStack_38 = resultFilename(*(char **)(globbuf.gl_pathc + (long)result * 8),tst->out,
                                        tst->err);
            if (pcStack_38 == (char *)0x0) {
              fprintf(_stderr,"Out of memory !\n");
              fatalError();
            }
          }
          if ((error == (char *)0x0) || (iVar2 = checkTestFile(error), iVar2 != 0)) {
            if ((pcStack_38 == (char *)0x0) || (iVar2 = checkTestFile(pcStack_38), iVar2 != 0)) {
              globbuf.gl_stat._4_4_ = xmlMemUsed();
              iVar2 = (*tst->func)(*(char **)(globbuf.gl_pathc + (long)result * 8),error,pcStack_38,
                                   tst->options | 0x10000);
              xmlResetLastError();
              if (iVar2 == 0) {
                iVar2 = xmlMemUsed();
                __stream = _stderr;
                if (iVar2 != globbuf.gl_stat._4_4_) {
                  uVar1 = *(undefined8 *)(globbuf.gl_pathc + (long)result * 8);
                  iVar2 = xmlMemUsed();
                  fprintf(__stream,"File %s leaked %d bytes\n",uVar1,
                          (ulong)(uint)(iVar2 - globbuf.gl_stat._4_4_));
                  nb_leaks = nb_leaks + 1;
                  i._0_4_ = (uint)i + 1;
                }
              }
              else {
                fprintf(_stderr,"File %s generated an error\n",
                        *(undefined8 *)(globbuf.gl_pathc + (long)result * 8));
                nb_errors = nb_errors + 1;
                i._0_4_ = (uint)i + 1;
              }
            }
            else {
              fprintf(_stderr,"Missing error file %s\n",pcStack_38);
            }
          }
          else {
            fprintf(_stderr,"Missing result file %s\n",error);
          }
          if (error != (char *)0x0) {
            free(error);
          }
          if (pcStack_38 != (char *)0x0) {
            free(pcStack_38);
          }
        }
      }
      globfree64((glob64_t *)local_88);
    }
    tst_local._4_4_ = (uint)i;
  }
  return tst_local._4_4_;
}

Assistant:

static int
launchTests(testDescPtr tst) {
    int res = 0, err = 0;
    size_t i;
    char *result;
    char *error;
    int mem;

    if (tst == NULL) return(-1);
    if (tst->in != NULL) {
	glob_t globbuf;

	globbuf.gl_offs = 0;
	glob(tst->in, GLOB_DOOFFS, NULL, &globbuf);
	for (i = 0;i < globbuf.gl_pathc;i++) {
	    if (!checkTestFile(globbuf.gl_pathv[i]))
	        continue;
	    if (tst->suffix != NULL) {
		result = resultFilename(globbuf.gl_pathv[i], tst->out,
					tst->suffix);
		if (result == NULL) {
		    fprintf(stderr, "Out of memory !\n");
		    fatalError();
		}
	    } else {
	        result = NULL;
	    }
	    if (tst->err != NULL) {
		error = resultFilename(globbuf.gl_pathv[i], tst->out,
		                        tst->err);
		if (error == NULL) {
		    fprintf(stderr, "Out of memory !\n");
		    fatalError();
		}
	    } else {
	        error = NULL;
	    }
	    if ((result) &&(!checkTestFile(result))) {
	        fprintf(stderr, "Missing result file %s\n", result);
	    } else if ((error) &&(!checkTestFile(error))) {
	        fprintf(stderr, "Missing error file %s\n", error);
	    } else {
		mem = xmlMemUsed();
		res = tst->func(globbuf.gl_pathv[i], result, error,
		                tst->options | XML_PARSE_COMPACT);
		xmlResetLastError();
		if (res != 0) {
		    fprintf(stderr, "File %s generated an error\n",
		            globbuf.gl_pathv[i]);
		    nb_errors++;
		    err++;
		}
		else if (xmlMemUsed() != mem) {
                    fprintf(stderr, "File %s leaked %d bytes\n",
                            globbuf.gl_pathv[i], xmlMemUsed() - mem);
                    nb_leaks++;
                    err++;
		}
	    }
	    if (result)
		free(result);
	    if (error)
		free(error);
	}
	globfree(&globbuf);
    } else {
        res = tst->func(NULL, NULL, NULL, tst->options);
	if (res != 0) {
	    nb_errors++;
	    err++;
	}
    }
    return(err);
}